

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie_swap.cpp
# Opt level: O0

int32_t utrie2_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                      UErrorCode *pErrorCode)

{
  uint uVar1;
  UBool UVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  ushort uVar6;
  uint32_t uVar7;
  UTrie2Header *outTrie;
  int local_58;
  UTrie2ValueBits valueBits;
  int32_t size;
  int32_t dataLength;
  UTrie2Header trie;
  UTrie2Header *inTrie;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  UVar2 = U_FAILURE(*pErrorCode);
  if (UVar2 == '\0') {
    if (((ds == (UDataSwapper *)0x0) || (inData == (void *)0x0)) ||
       ((-1 < length && (outData == (void *)0x0)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      ds_local._4_4_ = 0;
    }
    else if ((length < 0) || (0xf < length)) {
      uVar7 = (*ds->readUInt32)(*inData);
      uVar3 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 4));
      uVar4 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 6));
      uVar5 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 8));
      uVar6 = uVar3 & 0xf;
      uVar1 = (uint)uVar5;
      if ((uVar7 == 0x54726932) && (((uVar6 < 2 && (0x83f < uVar4)) && (0xbf < uVar1 * 4)))) {
        if ((uVar3 & 0xf) == 0) {
          local_58 = uVar1 * 8;
        }
        else {
          if (uVar6 != 1) {
            *pErrorCode = U_INVALID_FORMAT_ERROR;
            return 0;
          }
          local_58 = uVar1 * 0x10;
        }
        local_58 = local_58 + uVar4 + 0x10 + (uint)uVar4;
        if (-1 < length) {
          if (length < local_58) {
            *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
          }
          (*ds->swapArray32)(ds,inData,4,outData,pErrorCode);
          (*ds->swapArray16)(ds,(void *)((long)inData + 4),0xc,(void *)((long)outData + 4),
                             pErrorCode);
          if ((uVar3 & 0xf) == 0) {
            (*ds->swapArray16)(ds,(void *)((long)inData + 0x10),((uint)uVar4 + uVar1 * 4) * 2,
                               (void *)((long)outData + 0x10),pErrorCode);
          }
          else {
            if (uVar6 != 1) {
              *pErrorCode = U_INVALID_FORMAT_ERROR;
              return 0;
            }
            (*ds->swapArray16)(ds,(void *)((long)inData + 0x10),(uint)uVar4 << 1,
                               (void *)((long)outData + 0x10),pErrorCode);
            (*ds->swapArray32)(ds,(void *)((long)inData + (long)(int)(uint)uVar4 * 2 + 0x10),
                               uVar1 << 4,
                               (void *)((long)outData + (long)(int)(uint)uVar4 * 2 + 0x10),
                               pErrorCode);
          }
        }
        ds_local._4_4_ = local_58;
      }
      else {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        ds_local._4_4_ = 0;
      }
    }
    else {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      ds_local._4_4_ = 0;
    }
  }
  else {
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie2_swap(const UDataSwapper *ds,
            const void *inData, int32_t length, void *outData,
            UErrorCode *pErrorCode) {
    const UTrie2Header *inTrie;
    UTrie2Header trie;
    int32_t dataLength, size;
    UTrie2ValueBits valueBits;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || (length>=0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    if(length>=0 && length<(int32_t)sizeof(UTrie2Header)) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    inTrie=(const UTrie2Header *)inData;
    trie.signature=ds->readUInt32(inTrie->signature);
    trie.options=ds->readUInt16(inTrie->options);
    trie.indexLength=ds->readUInt16(inTrie->indexLength);
    trie.shiftedDataLength=ds->readUInt16(inTrie->shiftedDataLength);

    valueBits=(UTrie2ValueBits)(trie.options&UTRIE2_OPTIONS_VALUE_BITS_MASK);
    dataLength=(int32_t)trie.shiftedDataLength<<UTRIE2_INDEX_SHIFT;

    if( trie.signature!=UTRIE2_SIG ||
        valueBits<0 || UTRIE2_COUNT_VALUE_BITS<=valueBits ||
        trie.indexLength<UTRIE2_INDEX_1_OFFSET ||
        dataLength<UTRIE2_DATA_START_OFFSET
    ) {
        *pErrorCode=U_INVALID_FORMAT_ERROR; /* not a UTrie */
        return 0;
    }

    size=sizeof(UTrie2Header)+trie.indexLength*2;
    switch(valueBits) {
    case UTRIE2_16_VALUE_BITS:
        size+=dataLength*2;
        break;
    case UTRIE2_32_VALUE_BITS:
        size+=dataLength*4;
        break;
    default:
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    if(length>=0) {
        UTrie2Header *outTrie;

        if(length<size) {
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        outTrie=(UTrie2Header *)outData;

        /* swap the header */
        ds->swapArray32(ds, &inTrie->signature, 4, &outTrie->signature, pErrorCode);
        ds->swapArray16(ds, &inTrie->options, 12, &outTrie->options, pErrorCode);

        /* swap the index and the data */
        switch(valueBits) {
        case UTRIE2_16_VALUE_BITS:
            ds->swapArray16(ds, inTrie+1, (trie.indexLength+dataLength)*2, outTrie+1, pErrorCode);
            break;
        case UTRIE2_32_VALUE_BITS:
            ds->swapArray16(ds, inTrie+1, trie.indexLength*2, outTrie+1, pErrorCode);
            ds->swapArray32(ds, (const uint16_t *)(inTrie+1)+trie.indexLength, dataLength*4,
                                     (uint16_t *)(outTrie+1)+trie.indexLength, pErrorCode);
            break;
        default:
            *pErrorCode=U_INVALID_FORMAT_ERROR;
            return 0;
        }
    }

    return size;
}